

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O1

bool __thiscall Controller::readBoardFromFile(Controller *this,string *file)

{
  _Head_base<0UL,_Board_*,_false> __ptr;
  unsigned_long uVar1;
  BoardSize size;
  BoardMode mode;
  size_t sVar2;
  _Head_base<0UL,_Board_*,_false> this_00;
  bool bVar3;
  IOBoard ioBoard;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> values;
  IOBoard local_39;
  _Storage<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false> local_38;
  char local_20;
  
  IOBoard::readBoardFromFile
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &local_38._M_value,&local_39,file);
  if (local_20 == '\x01') {
    uVar1 = local_38._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1];
    sVar2 = Board::getSizeInt((this->board)._M_t.
                              super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                              super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                              super__Head_base<0UL,_Board_*,_false>._M_head_impl);
    if ((uint)uVar1 == sVar2) {
      if (local_20 == '\0') {
        std::__throw_bad_optional_access();
      }
      local_38._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_38._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      this_00._M_head_impl = (Board *)operator_new(0x38);
      size = Board::getSize((this->board)._M_t.
                            super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                            super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                            super__Head_base<0UL,_Board_*,_false>._M_head_impl);
      mode = Board::getMode((this->board)._M_t.
                            super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                            super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                            super__Head_base<0UL,_Board_*,_false>._M_head_impl);
      Board::Board(this_00._M_head_impl,&local_38._M_value,size,mode);
      __ptr._M_head_impl =
           (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
           super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
           super__Head_base<0UL,_Board_*,_false>._M_head_impl;
      (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
      super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
      super__Head_base<0UL,_Board_*,_false>._M_head_impl = this_00._M_head_impl;
      bVar3 = true;
      if (__ptr._M_head_impl != (Board *)0x0) {
        std::default_delete<Board>::operator()((default_delete<Board> *)this,__ptr._M_head_impl);
      }
      goto LAB_0010a377;
    }
    Message::putMessage(FILE_INFO_SIZE_IMPROPER,
                        local_38._M_value.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]);
  }
  bVar3 = false;
LAB_0010a377:
  if (local_20 == '\x01') {
    local_20 = 0;
    if (local_38._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38._M_value.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38._M_value.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage - local_38._0_8_);
    }
  }
  return bVar3;
}

Assistant:

bool Controller::readBoardFromFile( const std::string& file )
{
    IOBoard ioBoard;
    auto values = ioBoard.readBoardFromFile( file );
    if ( values == std::nullopt )
    {
        return false;
    }

    uint savedBoardSize = values->back();
    if ( savedBoardSize != board->getSizeInt() ) {
        Message::putMessage( Result::FILE_INFO_SIZE_IMPROPER, values->back() );
        return false;
    }

    values.value().pop_back();
    board.reset( new Board( std::move( values.value() ), board->getSize(), board->getMode() ));
    return true;
}